

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Random *this_00;
  double dVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  int8_t iVar4;
  SIMDLoadOp SVar5;
  int iVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  long lVar9;
  
  this_00 = &this->random;
  lVar9 = 0;
  SVar5 = Random::
          pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                    (this_00,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                     Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                     Load32x2UVec128);
  iVar4 = Random::get(this_00);
  dVar1 = log((double)(iVar4 + 1 + (uint)(iVar4 == -1)));
  switch(SVar5) {
  case Load8SplatVec128:
    lVar9 = 1;
    goto switchD_0012acd3_default;
  case Load16SplatVec128:
    iVar6 = Random::pick<int,int>(this_00,1,2);
    break;
  case Load32SplatVec128:
    iVar6 = Random::pick<int,int,int>(this_00,1,2,4);
    break;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar6 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    break;
  case Load32ZeroVec128:
  case Load64ZeroVec128:
    wasm::handle_unreachable
              ("Unexpected SIMD loads",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xc2d);
  default:
    goto switchD_0012acd3_default;
  }
  lVar9 = (long)iVar6;
switchD_0012acd3_default:
  dVar1 = floor(dVar1);
  pEVar7 = makePointer(this);
  uVar2 = *(undefined8 *)**(long **)(this->wasm + 0x78);
  uVar3 = ((undefined8 *)**(long **)(this->wasm + 0x78))[1];
  pEVar8 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x40,8)
  ;
  pEVar8->_id = SIMDLoadId;
  (pEVar8->type).id = 0;
  pEVar8[1].type.id = 0;
  *(undefined8 *)(pEVar8 + 2) = 0;
  pEVar8[1]._id = SVar5;
  pEVar8[1].type.id = (long)dVar1 & 0xffffffff;
  *(long *)(pEVar8 + 2) = lVar9;
  pEVar8[2].type.id = (uintptr_t)pEVar7;
  *(undefined8 *)(pEVar8 + 3) = uVar2;
  pEVar8[3].type.id = uVar3;
  wasm::SIMDLoad::finalize();
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  // TODO: add Load{32,64}Zero if merged to proposal
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
    case Load64ZeroVec128:
      WASM_UNREACHABLE("Unexpected SIMD loads");
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}